

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int cmsysProcess_SetPipeFile(cmsysProcess *cp,int prPipe,char *file)

{
  size_t sVar1;
  char *pcVar2;
  char **local_30;
  char **pfile;
  char *file_local;
  int prPipe_local;
  cmsysProcess *cp_local;
  
  if (cp == (cmsysProcess *)0x0) {
    cp_local._4_4_ = 0;
  }
  else {
    if (prPipe == 1) {
      local_30 = &cp->PipeFileSTDIN;
    }
    else if (prPipe == 2) {
      local_30 = &cp->PipeFileSTDOUT;
    }
    else {
      if (prPipe != 3) {
        return 0;
      }
      local_30 = &cp->PipeFileSTDERR;
    }
    if (*local_30 != (char *)0x0) {
      free(*local_30);
      *local_30 = (char *)0x0;
    }
    if (file != (char *)0x0) {
      sVar1 = strlen(file);
      pcVar2 = (char *)malloc(sVar1 + 1);
      *local_30 = pcVar2;
      if (*local_30 == (char *)0x0) {
        return 0;
      }
      strcpy(*local_30,file);
    }
    if (*local_30 != (char *)0x0) {
      cmsysProcess_SetPipeNative(cp,prPipe,(int *)0x0);
      cmsysProcess_SetPipeShared(cp,prPipe,0);
    }
    cp_local._4_4_ = 1;
  }
  return cp_local._4_4_;
}

Assistant:

int kwsysProcess_SetPipeFile(kwsysProcess* cp, int prPipe, const char* file)
{
  char** pfile;
  if(!cp)
    {
    return 0;
    }
  switch(prPipe)
    {
    case kwsysProcess_Pipe_STDIN: pfile = &cp->PipeFileSTDIN; break;
    case kwsysProcess_Pipe_STDOUT: pfile = &cp->PipeFileSTDOUT; break;
    case kwsysProcess_Pipe_STDERR: pfile = &cp->PipeFileSTDERR; break;
    default: return 0;
    }
  if(*pfile)
    {
    free(*pfile);
    *pfile = 0;
    }
  if(file)
    {
    *pfile = (char*)malloc(strlen(file)+1);
    if(!*pfile)
      {
      return 0;
      }
    strcpy(*pfile, file);
    }

  /* If we are redirecting the pipe, do not share it or use a native
     pipe.  */
  if(*pfile)
    {
    kwsysProcess_SetPipeNative(cp, prPipe, 0);
    kwsysProcess_SetPipeShared(cp, prPipe, 0);
    }
  return 1;
}